

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

cTValue * lj_tab_get(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  MRef MVar4;
  uint key_00;
  cTValue *unaff_R14;
  cTValue *pcVar5;
  char cVar6;
  
  uVar2 = key->it64;
  if ((long)uVar2 >> 0x2f == 0xfffffffffffffffb) {
    pcVar5 = (cTValue *)
             ((ulong)(t->hmask & *(uint *)((uVar2 & 0x7fffffffffff) + 0xc)) * 0x18 + (t->node).ptr64
             );
    do {
      if ((pcVar5[1].u64 & 0x7fffffffffff) == (uVar2 & 0x7fffffffffff) &&
          (pcVar5[1].u64 & 0xffff800000000000) == 0xfffd800000000000) goto LAB_001121fb;
      pcVar5 = (cTValue *)pcVar5[2].u64;
    } while (pcVar5 != (cTValue *)0x0);
    pcVar5 = (cTValue *)0x0;
LAB_001121fb:
    if (pcVar5 != (cTValue *)0x0) {
      return pcVar5;
    }
  }
  else {
    if ((ulong)((long)uVar2 >> 0x2f) < 0xfffffffffffffff2) {
      dVar1 = key->n;
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
        cVar6 = '\x02';
      }
      else {
        key_00 = (uint)dVar1;
        if (key_00 < t->asize) {
          unaff_R14 = (cTValue *)((long)(int)key_00 * 8 + (t->array).ptr64);
        }
        else {
          unaff_R14 = lj_tab_getinth(t,key_00);
        }
        cVar6 = unaff_R14 != (cTValue *)0x0;
      }
      if (cVar6 == '\0') goto LAB_00112292;
      if (cVar6 == '\x01') {
        return unaff_R14;
      }
    }
    else if (uVar2 == 0xffffffffffffffff) goto LAB_00112292;
    MVar4.ptr64 = (uint64_t)hashkey(t,key);
    do {
      iVar3 = lj_obj_equal((cTValue *)(MVar4.ptr64 + 8),key);
      if (iVar3 != 0) {
        return (cTValue *)MVar4.ptr64;
      }
      MVar4.ptr64 = ((cTValue *)(MVar4.ptr64 + 0x10))->u64;
    } while (MVar4.ptr64 != 0);
  }
LAB_00112292:
  return (cTValue *)((L->glref).ptr64 + 0xf8);
}

Assistant:

cTValue *lj_tab_get(lua_State *L, GCtab *t, cTValue *key)
{
  if (tvisstr(key)) {
    cTValue *tv = lj_tab_getstr(t, strV(key));
    if (tv)
      return tv;
  } else if (tvisint(key)) {
    cTValue *tv = lj_tab_getint(t, intV(key));
    if (tv)
      return tv;
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k) {
      cTValue *tv = lj_tab_getint(t, k);
      if (tv)
	return tv;
    } else {
      goto genlookup;  /* Else use the generic lookup. */
    }
  } else if (!tvisnil(key)) {
    Node *n;
  genlookup:
    n = hashkey(t, key);
    do {
      if (lj_obj_equal(&n->key, key))
	return &n->val;
    } while ((n = nextnode(n)));
  }
  return niltv(L);
}